

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_11_chaining_infix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *child;
  
  child = PVIP_node_new_children1(&G->data,PVIP_NODE_EQV,G->val[-1]);
  PVIP_node_push_child(G->val[-2],child);
  return;
}

Assistant:

YY_ACTION(void) yy_11_chaining_infix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define f2 G->val[-1]
#define f1 G->val[-2]
  yyprintf((stderr, "do yy_11_chaining_infix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {PVIPNode* tmp = PVIP_node_new_children1(&(G->data), PVIP_NODE_EQV,         f2); PVIP_node_push_child(f1, tmp); }\n"));
  PVIPNode* tmp = PVIP_node_new_children1(&(G->data), PVIP_NODE_EQV,         f2); PVIP_node_push_child(f1, tmp); ;
#undef f2
#undef f1
}